

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O3

void __thiscall MakefileGenerator::filterIncludedFiles(MakefileGenerator *this,char *var)

{
  QMakeProject *this_00;
  int iVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  QList<ProString> *this_01;
  iterator aend;
  iterator iVar5;
  long lVar6;
  long lVar7;
  ProString *pPVar8;
  long lVar9;
  const_iterator cVar10;
  long in_FS_OFFSET;
  ProKey local_68;
  long local_38;
  const_iterator __it;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->project;
  ProKey::ProKey(&local_68,var);
  this_01 = &QMakeEvaluator::valuesRef(&this_00->super_QMakeEvaluator,&local_68)->
             super_QList<ProString>;
  if (&(local_68.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pPVar8 = (this_01->d).ptr;
  lVar7 = (this_01->d).size;
  lVar6 = lVar7;
  cVar10.i = pPVar8;
  if (0 < lVar7 >> 2) {
    lVar9 = (lVar7 >> 2) + 1;
    lVar6 = lVar7 * 0x30;
    do {
      bVar3 = __gnu_cxx::__ops::_Iter_pred<MakefileGenerator::filterIncludedFiles(char_const*)::$_0>
              ::operator()((_Iter_pred<MakefileGenerator::filterIncludedFiles(char_const*)::__0> *)
                           this,cVar10);
      __it.i = cVar10.i;
      if (bVar3) goto LAB_001637fc;
      bVar3 = __gnu_cxx::__ops::_Iter_pred<MakefileGenerator::filterIncludedFiles(char_const*)::$_0>
              ::operator()((_Iter_pred<MakefileGenerator::filterIncludedFiles(char_const*)::__0> *)
                           this,cVar10.i + 1);
      __it.i = cVar10.i + 1;
      if (bVar3) goto LAB_001637fc;
      bVar3 = __gnu_cxx::__ops::_Iter_pred<MakefileGenerator::filterIncludedFiles(char_const*)::$_0>
              ::operator()((_Iter_pred<MakefileGenerator::filterIncludedFiles(char_const*)::__0> *)
                           this,cVar10.i + 2);
      __it.i = cVar10.i + 2;
      if (bVar3) goto LAB_001637fc;
      bVar3 = __gnu_cxx::__ops::_Iter_pred<MakefileGenerator::filterIncludedFiles(char_const*)::$_0>
              ::operator()((_Iter_pred<MakefileGenerator::filterIncludedFiles(char_const*)::__0> *)
                           this,cVar10.i + 3);
      __it.i = cVar10.i + 3;
      if (bVar3) goto LAB_001637fc;
      cVar10.i = cVar10.i + 4;
      lVar9 = lVar9 + -1;
      lVar6 = lVar6 + -0xc0;
    } while (1 < lVar9);
    lVar6 = (lVar6 >> 4) * -0x5555555555555555;
  }
  if (lVar6 != 1) {
    __it.i = cVar10.i;
    if (lVar6 != 2) {
      __it.i = pPVar8 + lVar7;
      if ((lVar6 != 3) ||
         (bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<MakefileGenerator::filterIncludedFiles(char_const*)::$_0>::operator()
                            ((_Iter_pred<MakefileGenerator::filterIncludedFiles(char_const*)::__0> *
                             )this,cVar10), __it.i = cVar10.i, bVar3)) goto LAB_001637fc;
      __it.i = cVar10.i + 1;
    }
    bVar3 = __gnu_cxx::__ops::_Iter_pred<MakefileGenerator::filterIncludedFiles(char_const*)::$_0>::
            operator()((_Iter_pred<MakefileGenerator::filterIncludedFiles(char_const*)::__0> *)this,
                       __it);
    if (bVar3) goto LAB_001637fc;
    cVar10.i = __it.i + 1;
  }
  bVar3 = __gnu_cxx::__ops::_Iter_pred<MakefileGenerator::filterIncludedFiles(char_const*)::$_0>::
          operator()((_Iter_pred<MakefileGenerator::filterIncludedFiles(char_const*)::__0> *)this,
                     cVar10);
  __it.i = pPVar8 + lVar7;
  if (bVar3) {
    __it.i = cVar10.i;
  }
LAB_001637fc:
  lVar7 = (long)__it.i - (long)pPVar8;
  if ((lVar7 >> 4) * -0x5555555555555555 - (this_01->d).size != 0) {
    aend = QList<ProString>::end(this_01);
    iVar5 = QList<ProString>::begin(this_01);
    cVar10.i = iVar5.i + lVar7;
    pPVar8 = iVar5.i + lVar7 + 0x30;
    if (pPVar8 != aend.i) {
      do {
        ProString::toQString((QString *)&local_68,pPVar8);
        iVar4 = QMakeSourceFileInfo::included(&this->super_QMakeSourceFileInfo,(QString *)&local_68)
        ;
        if (&(local_68.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i =
               ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate
                      (&(local_68.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (iVar4 < 1) {
          QString::operator=(&(cVar10.i)->m_string,(QString *)pPVar8);
          iVar4 = pPVar8->m_length;
          iVar1 = pPVar8->m_file;
          uVar2 = *(undefined4 *)&pPVar8->field_0x24;
          (cVar10.i)->m_offset = pPVar8->m_offset;
          (cVar10.i)->m_length = iVar4;
          (cVar10.i)->m_file = iVar1;
          *(undefined4 *)&(cVar10.i)->field_0x24 = uVar2;
          (cVar10.i)->m_hash = pPVar8->m_hash;
          cVar10.i = cVar10.i + 1;
        }
        pPVar8 = pPVar8 + 1;
      } while (pPVar8 != aend.i);
    }
    QList<ProString>::erase(this_01,cVar10,(const_iterator)aend.i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void
MakefileGenerator::filterIncludedFiles(const char *var)
{
    ProStringList &inputs = project->values(var);
    auto isIncluded = [this](const ProString &input) {
        return QMakeSourceFileInfo::included(input.toQString()) > 0;
    };
    inputs.removeIf(isIncluded);
}